

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapNoise(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t ss;
  undefined1 auVar1 [16];
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar2 = (*l->p->getMap)(l->p,out,x,z,w,h);
  if (iVar2 == 0) {
    lVar7 = 299999;
    if (l->mc < '\n') {
      lVar7 = 2;
    }
    lVar4 = (long)w;
    lVar6 = 0;
    if (0 < lVar4) {
      lVar6 = lVar4;
    }
    if (h < 1) {
      h = 0;
    }
    ss = l->startSeed;
    for (uVar5 = 0; uVar5 != (uint)h; uVar5 = uVar5 + 1) {
      for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
        if (out[lVar8] < 1) {
          iVar2 = 0;
        }
        else {
          uVar3 = getChunkSeed(ss,x + (int)lVar8,(int)uVar5 + z);
          auVar1._8_8_ = (long)uVar3 >> 0x3f;
          auVar1._0_8_ = (long)uVar3 >> 0x18;
          iVar2 = (SUB164(auVar1 % SEXT816(lVar7),4) >> 0x1f & (uint)lVar7) +
                  SUB164(auVar1 % SEXT816(lVar7),0) + 2;
        }
        out[lVar8] = iVar2;
      }
      out = out + lVar4;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapNoise(const Layer * l, int * out, int x, int z, int w, int h)
{
    int64_t i, j;
    int err = l->p->getMap(l->p, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    int mod = (l->mc <= MC_1_6) ? 2 : 299999;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            if (out[i + j*w] > 0)
            {
                cs = getChunkSeed(ss, i + x, j + z);
                out[i + j*w] = mcFirstInt(cs, mod)+2;
            }
            else
            {
                out[i + j*w] = 0;
            }
        }
    }

    return 0;
}